

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
          (Map<google::protobuf::MapKey,google::protobuf::MapValueRef> *this,const_iterator first,
          const_iterator last)

{
  value_type *key;
  MapValueRef *pMVar1;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_68;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
  local_48;
  
  local_68.node_ = first.it_.node_;
  local_68.m_ = first.it_.m_;
  local_68.bucket_index_ = first.it_.bucket_index_;
  if (first.it_.node_ != last.it_.node_) {
    do {
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
                (&local_48,*(InnerMap **)(this + 0x10),&(((local_68.node_)->kv).v_)->first,
                 (TreeIterator *)0x0);
      if (local_48.first.node_ == (Node *)0x0) {
        key = ((local_68.node_)->kv).v_;
        pMVar1 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                           ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)this,
                            &key->first);
        pMVar1->data_ = (key->second).data_;
        pMVar1->type_ = (key->second).type_;
      }
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
      ::operator++(&local_68);
    } while (local_68.node_ != last.it_.node_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }